

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_dce.c
# Opt level: O0

void lj_opt_dce(jit_State *J)

{
  jit_State *J_local;
  
  if ((J->flags & 0x40000) != 0) {
    dce_marksnap(J);
    dce_propagate(J);
    memset(J->bpropcache,0,0x80);
  }
  return;
}

Assistant:

void lj_opt_dce(jit_State *J)
{
  if ((J->flags & JIT_F_OPT_DCE)) {
    dce_marksnap(J);
    dce_propagate(J);
    memset(J->bpropcache, 0, sizeof(J->bpropcache));  /* Invalidate cache. */
  }
}